

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::build_workgroup_size
          (CompilerGLSL *this,
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *arguments,SpecializationConstant *wg_x,SpecializationConstant *wg_y,
          SpecializationConstant *wg_z)

{
  ulong uVar1;
  SPIREntryPoint *pSVar2;
  SPIRConstant *pSVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  byte bVar4;
  uint32_t uVar5;
  uint32_t local_5c;
  SpecializationConstant *local_58;
  string local_50;
  
  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)wg_y;
  local_58 = wg_z;
  pSVar2 = Compiler::get_entry_point(&this->super_Compiler);
  if ((pSVar2->workgroup_size).constant == 0) {
    uVar1 = (pSVar2->flags).lower;
    uVar5 = (wg_x->id).id;
    if (uVar5 != 0) {
      bVar4 = (byte)(uint)(uVar1 >> 0x26) & 1;
      goto LAB_002caa66;
    }
    if ((uVar1 >> 0x26 & 1) == 0) {
      bVar4 = 0;
LAB_002cab1b:
      join<char_const(&)[16],unsigned_int&>
                (&local_50,(spirv_cross *)"local_size_x = ",(char (*) [16])&pSVar2->workgroup_size,
                 (uint *)ts_1);
      goto LAB_002cab3a;
    }
    uVar5 = (pSVar2->workgroup_size).id_x;
    if (uVar5 == 0) {
      bVar4 = 1;
      goto LAB_002cab1b;
    }
    pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar5);
    local_5c = (pSVar3->m).c[0].r[0].u32;
    join<char_const(&)[16],unsigned_int>
              (&local_50,(spirv_cross *)"local_size_x = ",(char (*) [16])&local_5c,(uint *)ts_1);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(arguments,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    uVar5 = (wg_y->id).id;
    bVar4 = 1;
    if (uVar5 == 0) goto LAB_002cab86;
LAB_002cab58:
    if ((this->options).vulkan_semantics == true) {
      join<char_const(&)[19],unsigned_int_const&>
                (&local_50,(spirv_cross *)"local_size_y_id = ",(char (*) [19])&wg_y->constant_id,
                 (uint *)ts_1);
    }
    else {
      pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar5);
      join<char_const(&)[16],std::__cxx11::string&>
                (&local_50,(spirv_cross *)"local_size_y = ",
                 (char (*) [16])&pSVar3->specialization_constant_macro_name,ts_1);
    }
LAB_002cac27:
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(arguments,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    uVar5 = (local_58->id).id;
    if (uVar5 == 0) {
      if (bVar4 != 0) {
LAB_002cac6d:
        uVar5 = (pSVar2->workgroup_size).id_z;
        if (uVar5 != 0) {
          pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar5);
          local_5c = (pSVar3->m).c[0].r[0].u32;
          join<char_const(&)[16],unsigned_int>
                    (&local_50,(spirv_cross *)"local_size_z = ",(char (*) [16])&local_5c,
                     (uint *)ts_1);
          goto LAB_002cace7;
        }
      }
      join<char_const(&)[16],unsigned_int&>
                (&local_50,(spirv_cross *)"local_size_z = ",
                 (char (*) [16])&(pSVar2->workgroup_size).z,(uint *)ts_1);
      goto LAB_002cace7;
    }
  }
  else {
    uVar5 = (wg_x->id).id;
    bVar4 = 0;
    if (uVar5 == 0) goto LAB_002cab1b;
LAB_002caa66:
    if ((this->options).vulkan_semantics == true) {
      join<char_const(&)[19],unsigned_int_const&>
                (&local_50,(spirv_cross *)"local_size_x_id = ",(char (*) [19])&wg_x->constant_id,
                 (uint *)ts_1);
    }
    else {
      pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar5);
      join<char_const(&)[16],std::__cxx11::string&>
                (&local_50,(spirv_cross *)"local_size_x = ",
                 (char (*) [16])&pSVar3->specialization_constant_macro_name,ts_1);
    }
LAB_002cab3a:
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(arguments,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    uVar5 = (wg_y->id).id;
    if (uVar5 != 0) goto LAB_002cab58;
    if (bVar4 == 0) {
      bVar4 = 0;
LAB_002cac08:
      join<char_const(&)[16],unsigned_int&>
                (&local_50,(spirv_cross *)"local_size_y = ",
                 (char (*) [16])&(pSVar2->workgroup_size).y,(uint *)ts_1);
      goto LAB_002cac27;
    }
LAB_002cab86:
    uVar5 = (pSVar2->workgroup_size).id_y;
    if (uVar5 == 0) {
      bVar4 = 1;
      goto LAB_002cac08;
    }
    pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar5);
    local_5c = (pSVar3->m).c[0].r[0].u32;
    join<char_const(&)[16],unsigned_int>
              (&local_50,(spirv_cross *)"local_size_y = ",(char (*) [16])&local_5c,(uint *)ts_1);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(arguments,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    uVar5 = (local_58->id).id;
    if (uVar5 == 0) goto LAB_002cac6d;
  }
  if ((this->options).vulkan_semantics == true) {
    join<char_const(&)[19],unsigned_int_const&>
              (&local_50,(spirv_cross *)"local_size_z_id = ",(char (*) [19])&local_58->constant_id,
               (uint *)ts_1);
  }
  else {
    pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar5);
    join<char_const(&)[16],std::__cxx11::string&>
              (&local_50,(spirv_cross *)"local_size_z = ",
               (char (*) [16])&pSVar3->specialization_constant_macro_name,ts_1);
  }
LAB_002cace7:
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(arguments,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void CompilerGLSL::build_workgroup_size(SmallVector<string> &arguments, const SpecializationConstant &wg_x,
                                        const SpecializationConstant &wg_y, const SpecializationConstant &wg_z)
{
	auto &execution = get_entry_point();
	bool builtin_workgroup = execution.workgroup_size.constant != 0;
	bool use_local_size_id = !builtin_workgroup && execution.flags.get(ExecutionModeLocalSizeId);

	if (wg_x.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_x_id = ", wg_x.constant_id));
		else
			arguments.push_back(join("local_size_x = ", get<SPIRConstant>(wg_x.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_x)
		arguments.push_back(join("local_size_x = ", get<SPIRConstant>(execution.workgroup_size.id_x).scalar()));
	else
		arguments.push_back(join("local_size_x = ", execution.workgroup_size.x));

	if (wg_y.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_y_id = ", wg_y.constant_id));
		else
			arguments.push_back(join("local_size_y = ", get<SPIRConstant>(wg_y.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_y)
		arguments.push_back(join("local_size_y = ", get<SPIRConstant>(execution.workgroup_size.id_y).scalar()));
	else
		arguments.push_back(join("local_size_y = ", execution.workgroup_size.y));

	if (wg_z.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_z_id = ", wg_z.constant_id));
		else
			arguments.push_back(join("local_size_z = ", get<SPIRConstant>(wg_z.id).specialization_constant_macro_name));
	}
	else if (use_local_size_id && execution.workgroup_size.id_z)
		arguments.push_back(join("local_size_z = ", get<SPIRConstant>(execution.workgroup_size.id_z).scalar()));
	else
		arguments.push_back(join("local_size_z = ", execution.workgroup_size.z));
}